

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tree.h
# Opt level: O0

void __thiscall Tree<int>::levelTraversal(Tree<int> *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference ppNVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  value_type local_a0;
  value_type local_98;
  value_type local_90;
  Node<int> *local_88;
  Node<int> *node;
  value_type local_68;
  undefined1 local_60 [8];
  queue<Node<int>_*,_std::deque<Node<int>_*,_std::allocator<Node<int>_*>_>_> myQueue;
  Tree<int> *this_local;
  
  myQueue.c.super__Deque_base<Node<int>_*,_std::allocator<Node<int>_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)this;
  iVar2 = (*this->_vptr_Tree[8])();
  if (CONCAT44(extraout_var,iVar2) != 0) {
    std::queue<Node<int>*,std::deque<Node<int>*,std::allocator<Node<int>*>>>::
    queue<std::deque<Node<int>*,std::allocator<Node<int>*>>,void>
              ((queue<Node<int>*,std::deque<Node<int>*,std::allocator<Node<int>*>>> *)local_60);
    iVar2 = (*this->_vptr_Tree[8])();
    local_68 = (value_type)CONCAT44(extraout_var_00,iVar2);
    std::queue<Node<int>_*,_std::deque<Node<int>_*,_std::allocator<Node<int>_*>_>_>::push
              ((queue<Node<int>_*,_std::deque<Node<int>_*,_std::allocator<Node<int>_*>_>_> *)
               local_60,&local_68);
    node = (Node<int> *)0x0;
    std::queue<Node<int>_*,_std::deque<Node<int>_*,_std::allocator<Node<int>_*>_>_>::push
              ((queue<Node<int>_*,_std::deque<Node<int>_*,_std::allocator<Node<int>_*>_>_> *)
               local_60,&node);
    do {
      ppNVar3 = std::queue<Node<int>_*,_std::deque<Node<int>_*,_std::allocator<Node<int>_*>_>_>::
                front((queue<Node<int>_*,_std::deque<Node<int>_*,_std::allocator<Node<int>_*>_>_> *)
                      local_60);
      local_88 = *ppNVar3;
      std::queue<Node<int>_*,_std::deque<Node<int>_*,_std::allocator<Node<int>_*>_>_>::pop
                ((queue<Node<int>_*,_std::deque<Node<int>_*,_std::allocator<Node<int>_*>_>_> *)
                 local_60);
      if (local_88 == (Node<int> *)0x0) {
        bVar1 = std::queue<Node<int>_*,_std::deque<Node<int>_*,_std::allocator<Node<int>_*>_>_>::
                empty((queue<Node<int>_*,_std::deque<Node<int>_*,_std::allocator<Node<int>_*>_>_> *)
                      local_60);
        if (!bVar1) {
          local_a0 = (value_type)0x0;
          std::queue<Node<int>_*,_std::deque<Node<int>_*,_std::allocator<Node<int>_*>_>_>::push
                    ((queue<Node<int>_*,_std::deque<Node<int>_*,_std::allocator<Node<int>_*>_>_> *)
                     local_60,&local_a0);
          std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
        }
      }
      else {
        doSomeThing(this,local_88);
        iVar2 = (**local_88->_vptr_Node)();
        if (CONCAT44(extraout_var_01,iVar2) != 0) {
          iVar2 = (**local_88->_vptr_Node)();
          local_90 = (value_type)CONCAT44(extraout_var_02,iVar2);
          std::queue<Node<int>_*,_std::deque<Node<int>_*,_std::allocator<Node<int>_*>_>_>::push
                    ((queue<Node<int>_*,_std::deque<Node<int>_*,_std::allocator<Node<int>_*>_>_> *)
                     local_60,&local_90);
        }
        iVar2 = (*local_88->_vptr_Node[8])();
        if (CONCAT44(extraout_var_03,iVar2) != 0) {
          iVar2 = (*local_88->_vptr_Node[8])();
          local_98 = (value_type)CONCAT44(extraout_var_04,iVar2);
          std::queue<Node<int>_*,_std::deque<Node<int>_*,_std::allocator<Node<int>_*>_>_>::push
                    ((queue<Node<int>_*,_std::deque<Node<int>_*,_std::allocator<Node<int>_*>_>_> *)
                     local_60,&local_98);
        }
      }
      bVar1 = std::queue<Node<int>_*,_std::deque<Node<int>_*,_std::allocator<Node<int>_*>_>_>::empty
                        ((queue<Node<int>_*,_std::deque<Node<int>_*,_std::allocator<Node<int>_*>_>_>
                          *)local_60);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
    std::queue<Node<int>_*,_std::deque<Node<int>_*,_std::allocator<Node<int>_*>_>_>::~queue
              ((queue<Node<int>_*,_std::deque<Node<int>_*,_std::allocator<Node<int>_*>_>_> *)
               local_60);
  }
  return;
}

Assistant:

virtual void levelTraversal(void){
        if (getRoot() == nullptr){
            return;
        }
        queue<Node<T>*> myQueue;
        myQueue.push(getRoot());
        myQueue.push(0); // nullptr

        do{
            Node<T>* node = myQueue.front();
            myQueue.pop();
            if (node){ // node != nullptr
                doSomeThing(node);
                if (node->getLeftPoint() != nullptr){
                    myQueue.push( node->getLeftPoint());
                }
                if (node->getRightPoint() != nullptr){
                    myQueue.push(node->getRightPoint());
                }
            } else{
                if (!myQueue.empty()){
                    //end the the level
                    myQueue.push(0);
                    cout << endl;
                }
            }
        }while (!myQueue.empty());
    }